

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,Memory mem,void *owner)

{
  LogMessage *other;
  SerialArena *pSVar1;
  char *pcVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((Block *)mem.ptr < (Block *)0x50) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x74);
    other = LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: (kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize) <= (mem.size): "
                      );
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  this->owner_ = (void *)0x0;
  this->head_ = (Block *)mem.ptr;
  this->next_ = (SerialArena *)0x0;
  pSVar1 = (SerialArena *)Block::Pointer((Block *)this,0x18);
  pSVar1->space_used_ = 0;
  (pSVar1->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict1)this->head_;
  pSVar1->owner_ = (void *)mem.size;
  pSVar1->head_ = (Block *)this;
  pcVar2 = Block::Pointer((Block *)this,0x50);
  pSVar1->ptr_ = pcVar2;
  pcVar2 = Block::Pointer((Block *)this,(ulong)this->head_ & 0xfffffffffffffff8);
  pSVar1->limit_ = pcVar2;
  return pSVar1;
}

Assistant:

SerialArena* SerialArena::New(Memory mem, void* owner) {
  GOOGLE_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.size);

  auto b = new (mem.ptr) Block{nullptr, mem.size};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, owner);
}